

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_sample.c
# Opt level: O2

void stop_sample_instances_helper(void *object,_func_void_void_ptr *func,void *userdata)

{
  _Bool _Var1;
  ALLEGRO_SAMPLE *pAVar2;
  
  if (func == al_destroy_sample_instance) {
    pAVar2 = al_get_sample((ALLEGRO_SAMPLE_INSTANCE *)object);
    if ((pAVar2->buffer).f32 == (float *)userdata) {
      _Var1 = al_get_sample_instance_playing((ALLEGRO_SAMPLE_INSTANCE *)object);
      if (_Var1) {
        al_stop_sample_instance((ALLEGRO_SAMPLE_INSTANCE *)object);
        return;
      }
    }
  }
  return;
}

Assistant:

static void stop_sample_instances_helper(void *object, void (*func)(void *),
   void *userdata)
{
   ALLEGRO_SAMPLE_INSTANCE *splinst = object;

   /* This is ugly. */
   if (func == (void (*)(void *)) al_destroy_sample_instance
      && al_get_sample_data(al_get_sample(splinst)) == userdata
      && al_get_sample_instance_playing(splinst))
   {
      al_stop_sample_instance(splinst);
   }
}